

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

DOMNode * __thiscall xercesc_4_0::DOMNodeImpl::getTreeParentNode(DOMNodeImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar3;
  
  iVar2 = (*node->_vptr_DOMNode[5])(node);
  pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  if (pDVar3 == (DOMNode *)0x0) {
    iVar2 = (*node->_vptr_DOMNode[4])(node);
    sVar1 = (short)iVar2;
    if ((sVar1 == 0xc) || (sVar1 == 6)) {
      iVar2 = (*node->_vptr_DOMNode[0xc])(node);
      pDVar3 = (DOMNode *)
               (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))
                         ((long *)CONCAT44(extraout_var_01,iVar2));
      return pDVar3;
    }
    if (sVar1 == 2) {
      iVar2 = (*node->_vptr_DOMNode[0x2c])(node);
      return (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    }
    pDVar3 = (DOMNode *)0x0;
  }
  return pDVar3;
}

Assistant:

const DOMNode*   DOMNodeImpl::getTreeParentNode(const DOMNode* node) const {
    const DOMNode* parent=node->getParentNode();
    if(parent)
        return parent;
    short nodeType=node->getNodeType();
    switch(nodeType)
    {
    case DOMNode::ATTRIBUTE_NODE: return ((const DOMAttr*)node)->getOwnerElement();
    case DOMNode::NOTATION_NODE:
    case DOMNode::ENTITY_NODE:    return node->getOwnerDocument()->getDoctype();
    }
    return 0;
}